

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.h
# Opt level: O0

int tx_size_cost(MACROBLOCK *x,BLOCK_SIZE bsize,TX_SIZE tx_size)

{
  int iVar1;
  int iVar2;
  int iVar3;
  TX_SIZE in_DL;
  BLOCK_SIZE in_SIL;
  long in_RDI;
  int tx_size_ctx;
  MACROBLOCKD *xd;
  int depth;
  int32_t tx_size_cat;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((*(char *)(in_RDI + 0x24df0) == '\x02') && (iVar1 = block_signals_txsize(in_SIL), iVar1 != 0))
  {
    iVar1 = bsize_to_tx_size_cat(in_SIL);
    iVar2 = tx_size_to_depth(in_DL,in_SIL);
    iVar3 = get_tx_size_context((MACROBLOCKD *)
                                CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    return *(int *)(in_RDI + 0x8c98 + (long)iVar1 * 0x3c + (long)iVar3 * 0x14 + (long)iVar2 * 4);
  }
  return 0;
}

Assistant:

static inline int tx_size_cost(const MACROBLOCK *const x, BLOCK_SIZE bsize,
                               TX_SIZE tx_size) {
  assert(bsize == x->e_mbd.mi[0]->bsize);
  if (x->txfm_search_params.tx_mode_search_type != TX_MODE_SELECT ||
      !block_signals_txsize(bsize))
    return 0;

  const int32_t tx_size_cat = bsize_to_tx_size_cat(bsize);
  const int depth = tx_size_to_depth(tx_size, bsize);
  const MACROBLOCKD *const xd = &x->e_mbd;
  const int tx_size_ctx = get_tx_size_context(xd);
  return x->mode_costs.tx_size_cost[tx_size_cat][tx_size_ctx][depth];
}